

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og,int force,int nfill)

{
  int iVar1;
  long lVar2;
  uint *__dest;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uchar uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  
  lVar2 = os->lacing_fill;
  lVar4 = 0xff;
  if (lVar2 < 0xff) {
    lVar4 = lVar2;
  }
  uVar6 = (uint)lVar4;
  if (os == (ogg_stream_state *)0x0) {
    bVar13 = true;
  }
  else {
    bVar13 = os->body_data == (uchar *)0x0;
  }
  iVar3 = 0;
  if (!(bool)(uVar6 == 0 | bVar13)) {
    iVar1 = os->b_o_s;
    if (iVar1 == 0) {
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      else {
        uVar10 = 0;
        do {
          if ((char)os->lacing_vals[uVar10] != -1) {
            uVar6 = (int)uVar10 + 1;
            lVar4 = 0;
            goto LAB_001e52e2;
          }
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar10);
      }
      lVar4 = 0;
    }
    else {
      if ((int)uVar6 < 1) {
        lVar4 = -1;
        uVar6 = 0;
      }
      else {
        lVar4 = -1;
        uVar10 = 0;
        iVar3 = 0;
        iVar5 = 0;
        lVar12 = 0;
        do {
          if ((nfill < lVar12) && (3 < iVar3)) {
            force = 1;
            uVar6 = (uint)uVar10;
            break;
          }
          iVar3 = 0;
          if ((ulong)*(byte *)(os->lacing_vals + uVar10) != 0xff) {
            lVar4 = os->granule_vals[uVar10];
            iVar5 = iVar5 + 1;
            iVar3 = iVar5;
          }
          lVar12 = lVar12 + (ulong)*(byte *)(os->lacing_vals + uVar10);
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar10);
      }
      if (uVar6 == 0xff) {
        force = 1;
      }
    }
LAB_001e52e2:
    iVar3 = 0;
    if (force != 0) {
      builtin_memcpy(os->header,"OggS",5);
      os->header[5] = '\0';
      __dest = (uint *)os->lacing_vals;
      bVar13 = (*__dest >> 8 & 1) == 0;
      uVar7 = bVar13 + '\x02';
      if (iVar1 != 0) {
        uVar7 = bVar13;
      }
      os->header[5] = uVar7;
      lVar12 = (long)(int)uVar6;
      if ((os->e_o_s != 0) && (lVar2 == lVar12)) {
        os->header[5] = os->header[5] | 4;
      }
      os->b_o_s = 1;
      lVar8 = 0x56;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x5e);
      lVar4 = os->serialno;
      lVar8 = 0x5e;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x62);
      if (os->pageno == -1) {
        os->pageno = 0;
      }
      lVar4 = os->pageno;
      os->pageno = lVar4 + 1;
      lVar8 = 0x62;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x66);
      os->header[0x16] = '\0';
      os->header[0x17] = '\0';
      os->header[0x18] = '\0';
      os->header[0x19] = '\0';
      os->header[0x1a] = (uchar)uVar6;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          uVar11 = __dest[uVar9];
          os->header[uVar9 + 0x1b] = (uchar)uVar11;
          uVar11 = (int)uVar10 + (uVar11 & 0xff);
          uVar10 = (ulong)uVar11;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        uVar10 = (ulong)uVar11;
      }
      og->header = os->header;
      os->header_fill = uVar6 + 0x1b;
      og->header_len = (long)(int)(uVar6 + 0x1b);
      og->body = os->body_data + os->body_returned;
      og->body_len = uVar10;
      os->lacing_fill = lVar2 - lVar12;
      memmove(__dest,__dest + lVar12,(lVar2 - lVar12) * 4);
      memmove(os->granule_vals,os->granule_vals + lVar12,os->lacing_fill << 3);
      os->body_returned = os->body_returned + uVar10;
      ogg_page_checksum_set(og);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og, int force, int nfill){
  int i;
  int vals=0;
  int maxvals=(os->lacing_fill>255?255:os->lacing_fill);
  int bytes=0;
  long acc=0;
  ogg_int64_t granule_pos=-1;

  if(ogg_stream_check(os)) return(0);
  if(maxvals==0) return(0);

  /* construct a page */
  /* decide how many segments to include */

  /* If this is the initial header case, the first page must only include
     the initial header packet */
  if(os->b_o_s==0){  /* 'initial header page' case */
    granule_pos=0;
    for(vals=0;vals<maxvals;vals++){
      if((os->lacing_vals[vals]&0x0ff)<255){
        vals++;
        break;
      }
    }
  }else{

    /* The extra packets_done, packet_just_done logic here attempts to do two things:
       1) Don't unnecessarily span pages.
       2) Unless necessary, don't flush pages if there are less than four packets on
          them; this expands page size to reduce unnecessary overhead if incoming packets
          are large.
       These are not necessary behaviors, just 'always better than naive flushing'
       without requiring an application to explicitly request a specific optimized
       behavior. We'll want an explicit behavior setup pathway eventually as well. */

    int packets_done=0;
    int packet_just_done=0;
    for(vals=0;vals<maxvals;vals++){
      if(acc>nfill && packet_just_done>=4){
        force=1;
        break;
      }
      acc+=os->lacing_vals[vals]&0x0ff;
      if((os->lacing_vals[vals]&0xff)<255){
        granule_pos=os->granule_vals[vals];
        packet_just_done=++packets_done;
      }else
        packet_just_done=0;
    }
    if(vals==255)force=1;
  }

  if(!force) return(0);

  /* construct the header in temp storage */
  memcpy(os->header,"OggS",4);

  /* stream structure version */
  os->header[4]=0x00;

  /* continued packet flag? */
  os->header[5]=0x00;
  if((os->lacing_vals[0]&0x100)==0)os->header[5]|=0x01;
  /* first page flag? */
  if(os->b_o_s==0)os->header[5]|=0x02;
  /* last page flag? */
  if(os->e_o_s && os->lacing_fill==vals)os->header[5]|=0x04;
  os->b_o_s=1;

  /* 64 bits of PCM position */
  for(i=6;i<14;i++){
    os->header[i]=(unsigned char)(granule_pos&0xff);
    granule_pos>>=8;
  }

  /* 32 bits of stream serial number */
  {
    long serialno=os->serialno;
    for(i=14;i<18;i++){
      os->header[i]=(unsigned char)(serialno&0xff);
      serialno>>=8;
    }
  }

  /* 32 bits of page counter (we have both counter and page header
     because this val can roll over) */
  if(os->pageno==-1)os->pageno=0; /* because someone called
                                     stream_reset; this would be a
                                     strange thing to do in an
                                     encode stream, but it has
                                     plausible uses */
  {
    long pageno=os->pageno++;
    for(i=18;i<22;i++){
      os->header[i]=(unsigned char)(pageno&0xff);
      pageno>>=8;
    }
  }

  /* zero for computation; filled in later */
  os->header[22]=0;
  os->header[23]=0;
  os->header[24]=0;
  os->header[25]=0;

  /* segment table */
  os->header[26]=(unsigned char)(vals&0xff);
  for(i=0;i<vals;i++)
    bytes+=os->header[i+27]=(unsigned char)(os->lacing_vals[i]&0xff);

  /* set pointers in the ogg_page struct */
  og->header=os->header;
  og->header_len=os->header_fill=vals+27;
  og->body=os->body_data+os->body_returned;
  og->body_len=bytes;

  /* advance the lacing data and set the body_returned pointer */

  os->lacing_fill-=vals;
  memmove(os->lacing_vals,os->lacing_vals+vals,os->lacing_fill*sizeof(*os->lacing_vals));
  memmove(os->granule_vals,os->granule_vals+vals,os->lacing_fill*sizeof(*os->granule_vals));
  os->body_returned+=bytes;

  /* calculate the checksum */

  ogg_page_checksum_set(og);

  /* done */
  return(1);
}